

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O2

void __thiscall GcHeap::GcHeapImpl::VerifyHeap(GcHeapImpl *this)

{
  __node_base_ptr *func;
  size_type sVar1;
  _List_node_base *p_Var2;
  undefined1 local_b0 [8];
  unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_> visited;
  undefined1 auStack_58 [8];
  vector<Sexp_*,_std::allocator<Sexp_*>_> stack;
  Sexp *local_38;
  Sexp *ptr;
  
  DebugLog("[%d] verifying heap",this->gc_number);
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b0 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  ScanRoots<GcHeap::GcHeapImpl::VerifyHeap()::_lambda(Sexp**)_1_>
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_58);
  p_Var2 = (_List_node_base *)&this->finalize_queue;
  while (p_Var2 = (((_List_base<Sexp_*,_std::allocator<Sexp_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->finalize_queue) {
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::push_back
              ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_58,(value_type *)(p_Var2 + 1));
  }
  func = &visited._M_h._M_single_bucket;
  while( true ) {
    do {
      if (auStack_58 ==
          (undefined1  [8])
          stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        std::
        _Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_b0);
        std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base
                  ((_Vector_base<Sexp_*,_std::allocator<Sexp_*>_> *)auStack_58);
        return;
      }
      local_38 = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start[-1];
      stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
      _M_start = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
      sVar1 = std::
              _Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_b0,&local_38);
    } while (sVar1 != 0);
    std::__detail::
    _Insert_base<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_b0,&local_38);
    if ((local_38 < (Sexp *)this->heap_start) || ((Sexp *)this->heap_end < local_38)) break;
    if (local_38->padding == 0xabababababababab) {
      __assert_fail("ptr->padding != 0xabababababababab && \"observed a pointer that has been relocated!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                    ,0x19b,"void GcHeap::GcHeapImpl::VerifyHeap()");
    }
    visited._M_h._M_single_bucket = (__node_base_ptr)auStack_58;
    Sexp::TracePointers(local_38,(function<void_(Sexp_**)> *)func);
    std::_Function_base::~_Function_base((_Function_base *)func);
  }
  __assert_fail("(uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end && \"pointer not in heap!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x199,"void GcHeap::GcHeapImpl::VerifyHeap()");
}

Assistant:

void VerifyHeap() {
// The basic idea here is to traverse the entire
// heap and verify that every pointer is 1) within
// the valid heap range (i.e. we didn't accidentally introduce
// any wild pointers during a GC) and to ensure that every pointer
// points to a non-relocated object.
//
// When an object is relocated in a debug build, it is replaced
// with the bit pattern 0xab - if we see a pointer here that
// observes that bit pattern, we know that we failed to update
// a pointer somewhere.
#ifdef DEBUG
    DebugLog("[%d] verifying heap", gc_number);
    std::vector<Sexp *> stack;
    std::unordered_set<Sexp *> visited;
    ScanRoots([&](Sexp **ptr) {
      if (ptr == nullptr || *ptr == nullptr) {
        return;
      }

      if ((*ptr)->IsEmpty()) {
        return;
      }

      stack.push_back(*ptr);
    });

    // make sure we relocated the finalize queue right
    for (auto &it : finalize_queue) {
      stack.push_back(it);
    }

    while (!stack.empty()) {
      Sexp *ptr = stack.back();
      stack.pop_back();
      if (visited.count(ptr) != 0) {
        continue;
      }

      visited.insert(ptr);
      assert((uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end &&
             "pointer not in heap!");
      assert(ptr->padding != 0xabababababababab &&
             "observed a pointer that has been relocated!");
      ptr->TracePointers([&](Sexp **child) {
        assert(child != nullptr && "passed a null pointer to TracePointers!");
        assert(*child != nullptr && "observed a null pointer!");
        if ((*child)->IsEmpty()) {
          return;
        }

        stack.push_back(*child);
      });

      // DebugLog("heap verify: object %s is reachable",
      // ptr->DumpString().c_str());
    }
#endif
  }